

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::CopyScene(aiScene **_dest,aiScene *src,bool allocate)

{
  aiScene *paVar1;
  aiMetadata *this;
  ScenePrivateData *pSVar2;
  uint local_4c;
  aiScene *dest;
  bool allocate_local;
  aiScene *src_local;
  aiScene **_dest_local;
  
  if ((_dest != (aiScene **)0x0) && (src != (aiScene *)0x0)) {
    if (allocate) {
      paVar1 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(paVar1);
      *_dest = paVar1;
    }
    paVar1 = *_dest;
    if (src->mMetaData != (aiMetadata *)0x0) {
      this = (aiMetadata *)operator_new(0x18);
      aiMetadata::aiMetadata(this,src->mMetaData);
      paVar1->mMetaData = this;
    }
    paVar1->mNumAnimations = src->mNumAnimations;
    CopyPtrArray<aiAnimation>(&paVar1->mAnimations,src->mAnimations,paVar1->mNumAnimations);
    paVar1->mNumTextures = src->mNumTextures;
    CopyPtrArray<aiTexture>(&paVar1->mTextures,src->mTextures,paVar1->mNumTextures);
    paVar1->mNumMaterials = src->mNumMaterials;
    CopyPtrArray<aiMaterial>(&paVar1->mMaterials,src->mMaterials,paVar1->mNumMaterials);
    paVar1->mNumLights = src->mNumLights;
    CopyPtrArray<aiLight>(&paVar1->mLights,src->mLights,paVar1->mNumLights);
    paVar1->mNumCameras = src->mNumCameras;
    CopyPtrArray<aiCamera>(&paVar1->mCameras,src->mCameras,paVar1->mNumCameras);
    paVar1->mNumMeshes = src->mNumMeshes;
    CopyPtrArray<aiMesh>(&paVar1->mMeshes,src->mMeshes,paVar1->mNumMeshes);
    Copy(&paVar1->mRootNode,src->mRootNode);
    paVar1->mFlags = src->mFlags;
    if (paVar1->mPrivate != (void *)0x0) {
      pSVar2 = ScenePriv(src);
      if (pSVar2 == (ScenePrivateData *)0x0) {
        local_4c = 0;
      }
      else {
        pSVar2 = ScenePriv(src);
        local_4c = pSVar2->mPPStepsApplied;
      }
      pSVar2 = ScenePriv(paVar1);
      pSVar2->mPPStepsApplied = local_4c;
    }
  }
  return;
}

Assistant:

void SceneCombiner::CopyScene(aiScene** _dest,const aiScene* src,bool allocate) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if (allocate) {
        *_dest = new aiScene();
    }
    aiScene* dest = *_dest;
    ai_assert(nullptr != dest);

    // copy metadata
    if ( nullptr != src->mMetaData ) {
        dest->mMetaData = new aiMetadata( *src->mMetaData );
    }

    // copy animations
    dest->mNumAnimations = src->mNumAnimations;
    CopyPtrArray(dest->mAnimations,src->mAnimations,
        dest->mNumAnimations);

    // copy textures
    dest->mNumTextures = src->mNumTextures;
    CopyPtrArray(dest->mTextures,src->mTextures,
        dest->mNumTextures);

    // copy materials
    dest->mNumMaterials = src->mNumMaterials;
    CopyPtrArray(dest->mMaterials,src->mMaterials,
        dest->mNumMaterials);

    // copy lights
    dest->mNumLights = src->mNumLights;
    CopyPtrArray(dest->mLights,src->mLights,
        dest->mNumLights);

    // copy cameras
    dest->mNumCameras = src->mNumCameras;
    CopyPtrArray(dest->mCameras,src->mCameras,
        dest->mNumCameras);

    // copy meshes
    dest->mNumMeshes = src->mNumMeshes;
    CopyPtrArray(dest->mMeshes,src->mMeshes,
        dest->mNumMeshes);

    // now - copy the root node of the scene (deep copy, too)
    Copy( &dest->mRootNode, src->mRootNode);

    // and keep the flags ...
    dest->mFlags = src->mFlags;

    // source private data might be NULL if the scene is user-allocated (i.e. for use with the export API)
    if (dest->mPrivate != NULL) {
        ScenePriv(dest)->mPPStepsApplied = ScenePriv(src) ? ScenePriv(src)->mPPStepsApplied : 0;
    }
}